

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImDrawList * GetViewportDrawList(ImGuiViewportP *viewport,size_t drawlist_no,char *drawlist_name)

{
  int *piVar1;
  ImVec2 cr_min;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  ImDrawList *this;
  ImGuiContext *ctx;
  ImVec2 cr_max;
  
  pIVar3 = GImGui;
  this = viewport->DrawLists[drawlist_no];
  if (this == (ImDrawList *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    this = (ImDrawList *)(*GImAllocatorAllocFunc)(0xe0,GImAllocatorUserData);
    (this->_Splitter)._Channels.Size = 0;
    (this->_Splitter)._Channels.Capacity = 0;
    (this->_Splitter)._Channels.Data = (ImDrawChannel *)0x0;
    (this->CmdBuffer).Size = 0;
    (this->CmdBuffer).Capacity = 0;
    (this->CmdBuffer).Data = (ImDrawCmd *)0x0;
    (this->IdxBuffer).Size = 0;
    (this->IdxBuffer).Capacity = 0;
    (this->IdxBuffer).Data = (unsigned_short *)0x0;
    (this->VtxBuffer).Size = 0;
    (this->VtxBuffer).Capacity = 0;
    (this->VtxBuffer).Data = (ImDrawVert *)0x0;
    (this->_ClipRectStack).Size = 0;
    (this->_ClipRectStack).Capacity = 0;
    (this->_ClipRectStack).Data = (ImVec4 *)0x0;
    (this->_TextureIdStack).Size = 0;
    (this->_TextureIdStack).Capacity = 0;
    (this->_TextureIdStack).Data = (void **)0x0;
    (this->_Path).Size = 0;
    (this->_Path).Capacity = 0;
    (this->_Path).Data = (ImVec2 *)0x0;
    (this->_CmdHeader).ClipRect.x = 0.0;
    (this->_CmdHeader).ClipRect.y = 0.0;
    (this->_CmdHeader).ClipRect.z = 0.0;
    (this->_CmdHeader).ClipRect.w = 0.0;
    (this->_CmdHeader).TextureId = (ImTextureID)0x0;
    (this->_CmdHeader).VtxOffset = 0;
    (this->_CmdHeader).IdxOffset = 0;
    *(undefined8 *)&(this->_CmdHeader).ElemCount = 0;
    (this->_CmdHeader).UserCallback = (ImDrawCallback)0x0;
    *(undefined8 *)((long)&(this->_CmdHeader).UserCallback + 4) = 0;
    *(undefined8 *)((long)&(this->_CmdHeader).UserCallbackData + 4) = 0;
    (this->_Splitter)._Count = 1;
    this->_Data = &pIVar3->DrawListSharedData;
    this->Flags = 0;
    this->_VtxCurrentIdx = 0;
    this->_VtxWritePtr = (ImDrawVert *)0x0;
    this->_IdxWritePtr = (ImDrawIdx *)0x0;
    this->_OwnerName = drawlist_name;
    viewport->DrawLists[drawlist_no] = this;
  }
  if (viewport->LastFrameDrawLists[drawlist_no] != pIVar3->FrameCount) {
    ImDrawList::_ResetForNewFrame(this);
    ImDrawList::PushTextureID(this,((pIVar3->IO).Fonts)->TexID);
    cr_min = (viewport->super_ImGuiViewport).Pos;
    IVar2 = (viewport->super_ImGuiViewport).Size;
    cr_max.x = IVar2.x + cr_min.x;
    cr_max.y = IVar2.y + cr_min.y;
    ImDrawList::PushClipRect(this,cr_min,cr_max,false);
    viewport->LastFrameDrawLists[drawlist_no] = pIVar3->FrameCount;
  }
  return this;
}

Assistant:

static ImDrawList* GetViewportDrawList(ImGuiViewportP* viewport, size_t drawlist_no, const char* drawlist_name)
{
    // Create the draw list on demand, because they are not frequently used for all viewports
    ImGuiContext& g = *GImGui;
    IM_ASSERT(drawlist_no < IM_ARRAYSIZE(viewport->DrawLists));
    ImDrawList* draw_list = viewport->DrawLists[drawlist_no];
    if (draw_list == NULL)
    {
        draw_list = IM_NEW(ImDrawList)(&g.DrawListSharedData);
        draw_list->_OwnerName = drawlist_name;
        viewport->DrawLists[drawlist_no] = draw_list;
    }

    // Our ImDrawList system requires that there is always a command
    if (viewport->LastFrameDrawLists[drawlist_no] != g.FrameCount)
    {
        draw_list->_ResetForNewFrame();
        draw_list->PushTextureID(g.IO.Fonts->TexID);
        draw_list->PushClipRect(viewport->Pos, viewport->Pos + viewport->Size, false);
        viewport->LastFrameDrawLists[drawlist_no] = g.FrameCount;
    }
    return draw_list;
}